

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O1

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  cmMakefile *this_00;
  string *psVar8;
  cmUVProcessChainBuilder *this_01;
  istream *piVar9;
  long lVar10;
  long *plVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view arg;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string line;
  string ldConfigPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ldConfigCommand;
  RegularExpressionMatch match;
  cmUVProcessChainBuilder builder;
  undefined1 auStack_198 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [17];
  undefined7 uStack_157;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long local_138 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 local_110 [32];
  char *local_f0 [2];
  char local_e0 [16];
  long *local_d0 [2];
  long local_c0;
  char *local_b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  undefined1 local_60 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_48;
  
  auStack_198._8_8_ = this;
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths;
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  pcVar1 = local_110 + 0x10;
  local_110._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CMAKE_LDCONFIG_COMMAND","");
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_110);
  local_148._M_allocated_capacity = (size_type)local_138;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((pointer)local_110._0_8_ != pcVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (local_148._8_8_ == 0) {
    local_110._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/sbin","");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/usr/sbin","");
    plVar11 = &local_c0;
    local_d0[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/usr/local/sbin","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_110;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168,__l,(allocator_type *)(auStack_198 + 0x10));
    cmsys::SystemTools::FindProgram
              ((string *)local_60,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,false);
    std::__cxx11::string::operator=((string *)local_148._M_local_buf,(string *)local_60);
    if (local_60._0_8_ != (long)local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
    lVar10 = -0x60;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0);
    if (local_148._8_8_ == 0) {
      pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_198._8_8_ + 8);
      local_110._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"Could not find ldconfig","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_110);
      if ((pointer)local_110._0_8_ != pcVar1) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      bVar5 = false;
      goto LAB_004c68ba;
    }
  }
  arg._M_str = (char *)local_148._M_allocated_capacity;
  arg._M_len = local_148._8_8_;
  cmExpandedList_abi_cxx11_(&local_128,arg,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_128,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_60);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream
                      ((cmUVProcessChainBuilder *)local_60,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_128);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)auStack_198);
  bVar5 = cmUVProcessChain::Valid((cmUVProcessChain *)auStack_198);
  if (bVar5) {
    local_168._0_8_ = local_168 + 0x10;
    local_168._8_8_ = (pointer)0x0;
    local_168[0x10] = 0;
    if (GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
        regex == '\0') {
      iVar7 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::regex);
      if (iVar7 != 0) {
        GetLDConfigPaths::regex.regmust = (char *)0x0;
        GetLDConfigPaths::regex.program = (char *)0x0;
        GetLDConfigPaths::regex.progsize = 0;
        memset(&GetLDConfigPaths::regex,0,0xaa);
        cmsys::RegularExpression::compile(&GetLDConfigPaths::regex,"^([^\t:]*):");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                     &__dso_handle);
        __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
    }
    paVar4 = &local_188.field_2;
    while( true ) {
      piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)auStack_198);
      cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar9,(string *)local_168,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      memset((RegularExpressionMatch *)local_110,0,0xa8);
      bVar5 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,(char *)local_168._0_8_,
                         (RegularExpressionMatch *)local_110);
      if (bVar5) {
        local_188._M_dataplus._M_p = (pointer)paVar4;
        if ((char *)local_110._8_8_ == (char *)0x0) {
          local_188._M_string_length = 0;
          local_188.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(auStack_198 + 0x10),local_110._8_8_,local_b8);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (auStack_198 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar4) {
          operator_delete(local_188._M_dataplus._M_p,
                          CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                   local_188.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    bVar5 = cmUVProcessChain::Wait((cmUVProcessChain *)auStack_198,-1);
    pcVar1 = local_110 + 0x10;
    if (bVar5) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)(auStack_198 + 0x10),(cmUVProcessChain *)auStack_198);
      if ((*(long **)local_188._M_dataplus._M_p == (long *)0x0) ||
         (**(long **)local_188._M_dataplus._M_p != 0)) {
        pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_198._8_8_ + 8);
        local_110._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"Failed to run ldconfig","");
        cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_110);
        if ((pointer)local_110._0_8_ != pcVar1) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        bVar5 = false;
      }
      else {
        bVar5 = true;
      }
      if ((StdioConfiguration)local_188._M_dataplus._M_p != (StdioConfiguration)0x0) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) -
                        (long)local_188._M_dataplus._M_p);
      }
    }
    else {
      pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_198._8_8_ + 8);
      local_110._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"Failed to wait on ldconfig process","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_110);
      if ((pointer)local_110._0_8_ != pcVar1) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      bVar5 = false;
    }
    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,CONCAT71(uStack_157,local_168[0x10]) + 1);
    }
  }
  else {
    pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_198._8_8_ + 8);
    local_110._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Failed to start ldconfig process","");
    cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_110);
    if ((pointer)local_110._0_8_ != pcVar1) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    bVar5 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)auStack_198);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
LAB_004c68ba:
  if ((long *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  std::vector<std::string> ldConfigCommand = cmExpandedList(ldConfigPath);
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid()) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}